

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[3],char_const*const&>
          (String *__return_storage_ptr__,kj *this,char (*params) [3],char **params_1)

{
  ArrayPtr<const_char> local_38;
  ArrayPtr<const_char> local_28;
  
  local_28 = toCharSequence<char_const(&)[3]>((char (*) [3])this);
  local_38 = toCharSequence<char_const*const&>((char **)params);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_28,&local_38,&local_38);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}